

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QDebug operator<<(QDebug *stream,QFont *font)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  StyleHint SVar4;
  StyleHint SVar5;
  StyleStrategy SVar6;
  StyleStrategy SVar7;
  Style SVar8;
  Style SVar9;
  int iVar10;
  SpacingType SVar11;
  HintingPreference HVar12;
  QDebug *pQVar13;
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  qreal qVar14;
  bool resolved;
  int property;
  QDebugStateSaver saver_1;
  QDebug debug;
  QString fontDescription;
  QDebugStateSaver saver;
  QFont defaultFont;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  QFontPrivate *in_stack_fffffffffffffdf0;
  undefined2 in_stack_fffffffffffffdf8;
  byte in_stack_fffffffffffffdfa;
  undefined1 in_stack_fffffffffffffdfb;
  HintingPreference in_stack_fffffffffffffdfc;
  QDebug *in_stack_fffffffffffffe00;
  QFont *in_stack_fffffffffffffe08;
  SpacingType in_stack_fffffffffffffe14;
  QDebug *in_stack_fffffffffffffe18;
  QDebug *in_stack_fffffffffffffe28;
  QFlagsStorage<QFont::ResolveProperties> flags;
  QDebug *in_stack_fffffffffffffe38;
  uint local_160;
  QFlag local_140 [2];
  QDebug local_138;
  QDebug local_130 [10];
  QDebug local_e0;
  QDebug local_d8;
  QDebug local_d0;
  QDebug local_c8;
  QDebug local_c0;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  undefined1 *local_60;
  QDebug local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_20,in_RSI);
  pQVar13 = QDebug::nospace(in_RSI);
  QDebug::noquote(pQVar13);
  QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe38);
  iVar3 = QDebug::verbosity(in_RSI);
  if (iVar3 == 2) {
    QFont::toString(in_stack_fffffffffffffe08);
    QDebug::operator<<(in_stack_fffffffffffffe00,
                       (QString *)
                       CONCAT44(in_stack_fffffffffffffdfc,
                                CONCAT13(in_stack_fffffffffffffdfb,
                                         CONCAT12(in_stack_fffffffffffffdfa,
                                                  in_stack_fffffffffffffdf8))));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe38);
    QString::~QString((QString *)0x718c8c);
    QDebug::QDebug((QDebug *)in_stack_fffffffffffffdf0,
                   (QDebug *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  else {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x718ceb);
    local_58.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
    QDebug::QDebug(in_stack_fffffffffffffe00,
                   (QString *)
                   CONCAT44(in_stack_fffffffffffffdfc,
                            CONCAT13(in_stack_fffffffffffffdfb,
                                     CONCAT12(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)))
                  );
    QDebug::nospace(&local_58);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    operator_new(0x98);
    QFontPrivate::QFontPrivate(in_stack_fffffffffffffdf0);
    QFont::QFont((QFont *)in_stack_fffffffffffffdf0,
                 (QFontPrivate *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    for (local_160 = 2; flags.i = (Int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
        (int)local_160 < 0xfffff; local_160 = local_160 << 1) {
      if (((*(uint *)(in_RDX + 8) & local_160) != 0) ||
         (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 0)) {
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_60,&local_58);
        if (local_160 == 2) {
          qVar14 = QFont::pointSizeF((QFont *)0x718f25);
          if (qVar14 < 0.0) {
            iVar3 = QFont::pixelSize((QFont *)0x718f66);
            if (-1 < iVar3) {
              QFont::pixelSize((QFont *)0x718f78);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                 (char *)in_stack_fffffffffffffe38);
            }
          }
          else {
            QFont::pointSizeF((QFont *)0x718f3b);
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                               (double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
                              );
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe38
                              );
          }
LAB_007198f8:
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe38);
        }
        else {
          if (local_160 == 4) {
            SVar4 = QFont::styleHint((QFont *)0x718fae);
            SVar5 = QFont::styleHint((QFont *)0x718fc2);
            if ((SVar4 == SVar5) && (iVar3 = QDebug::verbosity(in_RSI), iVar3 == 1))
            goto LAB_00719917;
            pQVar13 = QDebug::verbosity(&local_58,1);
            QDebug::QDebug(&local_70,pQVar13);
            QFont::styleHint((QFont *)0x719020);
            operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
            QDebug::~QDebug(&local_68);
            QDebug::~QDebug(&local_70);
            goto LAB_007198f8;
          }
          if (local_160 == 8) {
            SVar6 = QFont::styleStrategy((QFont *)0x719063);
            SVar7 = QFont::styleStrategy((QFont *)0x719077);
            if ((SVar6 == SVar7) && (iVar3 = QDebug::verbosity(in_RSI), iVar3 == 1))
            goto LAB_00719917;
            pQVar13 = QDebug::verbosity(&local_58,1);
            QDebug::QDebug(&local_80,pQVar13);
            QFont::styleStrategy((QFont *)0x7190d5);
            operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
            QDebug::~QDebug(&local_78);
            QDebug::~QDebug(&local_80);
            goto LAB_007198f8;
          }
          if (local_160 == 0x10) {
            pQVar13 = QDebug::verbosity(&local_58,1);
            QDebug::QDebug(&local_90,pQVar13);
            QFont::weight((QFont *)0x71913a);
            operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
            QDebug::~QDebug(&local_88);
            QDebug::~QDebug(&local_90);
            goto LAB_007198f8;
          }
          if (local_160 == 0x20) {
            SVar8 = QFont::style((QFont *)0x71917d);
            SVar9 = QFont::style((QFont *)0x719191);
            if ((SVar8 != SVar9) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              pQVar13 = QDebug::verbosity(&local_58,0);
              QDebug::QDebug(&local_a0,pQVar13);
              QFont::style((QFont *)0x7191ec);
              operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
              QDebug::~QDebug(&local_98);
              QDebug::~QDebug(&local_a0);
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x40) {
            bVar2 = QFont::underline((QFont *)0x71922f);
            bVar1 = QFont::underline((QFont *)0x719245);
            if ((bVar2 != bVar1) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                 (char *)in_stack_fffffffffffffe38);
              QFont::underline((QFont *)0x71929d);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                                 SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0));
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x80) {
            bVar2 = QFont::overline((QFont *)0x7192bf);
            bVar1 = QFont::overline((QFont *)0x7192d5);
            if ((bVar2 != bVar1) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                 (char *)in_stack_fffffffffffffe38);
              QFont::overline((QFont *)0x71932d);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                                 SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0));
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x100) {
            bVar2 = QFont::strikeOut((QFont *)0x71934f);
            bVar1 = QFont::strikeOut((QFont *)0x719365);
            if ((bVar2 != bVar1) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              in_stack_fffffffffffffe38 =
                   QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                      (char *)in_stack_fffffffffffffe38);
              QFont::strikeOut((QFont *)0x7193bd);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                                 SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0));
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x200) {
            bVar2 = QFont::fixedPitch((QFont *)0x7193df);
            bVar1 = QFont::fixedPitch((QFont *)0x7193f5);
            if ((bVar2 != bVar1) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              in_stack_fffffffffffffe28 =
                   QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                      (char *)in_stack_fffffffffffffe38);
              QFont::fixedPitch((QFont *)0x71944d);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                                 SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0));
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x400) {
            iVar3 = QFont::stretch((QFont *)0x71946f);
            iVar10 = QFont::stretch((QFont *)0x719480);
            if ((iVar3 != iVar10) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              pQVar13 = QDebug::verbosity(&local_58,0);
              QDebug::QDebug(&local_b0,pQVar13);
              QFont::stretch((QFont *)0x7194d8);
              operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
              QDebug::~QDebug(&local_a8);
              QDebug::~QDebug(&local_b0);
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x800) {
            bVar2 = QFont::kerning((QFont *)0x71951b);
            bVar1 = QFont::kerning((QFont *)0x719531);
            if ((bVar2 != bVar1) || (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              in_stack_fffffffffffffe18 =
                   QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                      (char *)in_stack_fffffffffffffe38);
              QFont::kerning((QFont *)0x719589);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                                 SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0));
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x1000) {
            in_stack_fffffffffffffe14 = QFont::capitalization((QFont *)0x7195ab);
            SVar11 = QFont::capitalization((QFont *)0x7195bc);
            if ((in_stack_fffffffffffffe14 != SVar11) ||
               (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              pQVar13 = QDebug::verbosity(&local_58,0);
              QDebug::QDebug(&local_c0,pQVar13);
              QFont::capitalization((QFont *)0x719614);
              operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
              QDebug::~QDebug(&local_b8);
              QDebug::~QDebug(&local_c0);
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x2000) {
            in_stack_fffffffffffffe08 = (QFont *)QFont::letterSpacing((QFont *)0x719657);
            qVar14 = QFont::letterSpacing((QFont *)0x71966a);
            if ((((double)in_stack_fffffffffffffe08 != qVar14) ||
                (NAN((double)in_stack_fffffffffffffe08) || NAN(qVar14))) ||
               (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              in_stack_fffffffffffffe00 =
                   QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                      (char *)in_stack_fffffffffffffe38);
              QFont::letterSpacing((QFont *)0x7196c3);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                                 (double)CONCAT44(in_stack_fffffffffffffdec,
                                                  in_stack_fffffffffffffde8));
              QDebug::verbosity(&local_58,0);
              pQVar13 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                           (char *)in_stack_fffffffffffffe38);
              QDebug::QDebug(&local_d0,pQVar13);
              QFont::letterSpacingType((QFont *)0x719708);
              operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                 (char *)in_stack_fffffffffffffe38);
              QDebug::~QDebug(&local_c8);
              QDebug::~QDebug(&local_d0);
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x8000) {
            in_stack_fffffffffffffdfc = QFont::hintingPreference((QFont *)0x71975f);
            HVar12 = QFont::hintingPreference((QFont *)0x719770);
            if ((in_stack_fffffffffffffdfc != HVar12) ||
               (iVar3 = QDebug::verbosity(in_RSI), iVar3 != 1)) {
              pQVar13 = QDebug::verbosity(&local_58,0);
              QDebug::QDebug(&local_e0,pQVar13);
              QFont::hintingPreference((QFont *)0x7197c8);
              operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
              QDebug::~QDebug(&local_d8);
              QDebug::~QDebug(&local_e0);
              goto LAB_007198f8;
            }
          }
          else if (local_160 == 0x10000) {
            QFont::styleName((QFont *)CONCAT44(in_stack_fffffffffffffdfc,
                                               CONCAT13(in_stack_fffffffffffffdfb,
                                                        CONCAT12(in_stack_fffffffffffffdfa,
                                                                 in_stack_fffffffffffffdf8))));
            QFont::styleName((QFont *)CONCAT44(in_stack_fffffffffffffdfc,
                                               CONCAT13(in_stack_fffffffffffffdfb,
                                                        CONCAT12(in_stack_fffffffffffffdfa,
                                                                 in_stack_fffffffffffffdf8))));
            bVar2 = operator==((QString *)in_stack_fffffffffffffdf0,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            in_stack_fffffffffffffdfa = false;
            if (bVar2) {
              iVar3 = QDebug::verbosity(in_RSI);
              in_stack_fffffffffffffdfa = iVar3 == 1;
            }
            in_stack_fffffffffffffdfb = in_stack_fffffffffffffdfa;
            QString::~QString((QString *)0x719878);
            QString::~QString((QString *)0x719885);
            if ((in_stack_fffffffffffffdfa & 1) == 0) {
              in_stack_fffffffffffffdf0 =
                   (QFontPrivate *)
                   QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                      (char *)in_stack_fffffffffffffe38);
              QFont::styleName((QFont *)CONCAT44(in_stack_fffffffffffffdfc,
                                                 CONCAT13(in_stack_fffffffffffffdfb,
                                                          CONCAT12(in_stack_fffffffffffffdfa,
                                                                   in_stack_fffffffffffffdf8))));
              QDebug::operator<<(in_stack_fffffffffffffe00,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffdfc,
                                          CONCAT13(in_stack_fffffffffffffdfb,
                                                   CONCAT12(in_stack_fffffffffffffdfa,
                                                            in_stack_fffffffffffffdf8))));
              QString::~QString((QString *)0x7198e9);
              goto LAB_007198f8;
            }
          }
        }
LAB_00719917:
        QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_60);
      }
    }
    iVar3 = QDebug::verbosity(in_RSI);
    if (iVar3 < 1) {
      QString::chop((longlong)&local_50);
    }
    else {
      QDebug::verbosity(&local_58,0);
      pQVar13 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe08,
                                   (char *)in_stack_fffffffffffffe38);
      QDebug::QDebug(&local_138,pQVar13);
      QFlag::QFlag(local_140,*(uint *)(in_RDX + 8));
      QFlags<QFont::ResolveProperties>::QFlagsStorageHelper
                ((QFlags<QFont::ResolveProperties> *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (QFlag)(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      operator<<<QFlags<QFont::ResolveProperties>,_true>
                (in_stack_fffffffffffffe18,(QFlags<QFont::ResolveProperties>)flags.i);
      QDebug::~QDebug(local_130);
      QDebug::~QDebug(&local_138);
    }
    QDebug::operator<<(in_stack_fffffffffffffe00,
                       (QString *)
                       CONCAT44(in_stack_fffffffffffffdfc,
                                CONCAT13(in_stack_fffffffffffffdfb,
                                         CONCAT12(in_stack_fffffffffffffdfa,
                                                  in_stack_fffffffffffffdf8))));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffdf0,
                       (char)((uint)in_stack_fffffffffffffdec >> 0x18));
    QDebug::QDebug((QDebug *)in_stack_fffffffffffffdf0,
                   (QDebug *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    QFont::~QFont((QFont *)0x719a53);
    QDebug::~QDebug(&local_58);
    QString::~QString((QString *)0x719a6d);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug stream, const QFont &font)
{
    QDebugStateSaver saver(stream);
    stream.nospace().noquote();
    stream << "QFont(";

    if (stream.verbosity() == QDebug::DefaultVerbosity) {
        stream << font.toString() << ")";
        return stream;
    }

    QString fontDescription;
    QDebug debug(&fontDescription);
    debug.nospace();

    const QFont defaultFont(new QFontPrivate);

    for (int property = QFont::SizeResolved; property < QFont::AllPropertiesResolved; property <<= 1) {
        const bool resolved = (font.resolve_mask & property) != 0;
        if (!resolved && stream.verbosity() == QDebug::MinimumVerbosity)
            continue;

        #define QFONT_DEBUG_SKIP_DEFAULT(prop) \
            if ((font.prop() == defaultFont.prop()) && stream.verbosity() == 1) \
                continue;

        QDebugStateSaver saver(debug);

        switch (property) {
        case QFont::SizeResolved:
            if (font.pointSizeF() >= 0)
                debug << font.pointSizeF() << "pt";
            else if (font.pixelSize() >= 0)
                debug << font.pixelSize() << "px";
            else
                Q_UNREACHABLE();
            break;
        case QFont::StyleHintResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleHint);
            debug.verbosity(1) << font.styleHint(); break;
        case QFont::StyleStrategyResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleStrategy);
            debug.verbosity(1) << font.styleStrategy(); break;
        case QFont::WeightResolved:
            debug.verbosity(1) << QFont::Weight(font.weight()); break;
        case QFont::StyleResolved:
            QFONT_DEBUG_SKIP_DEFAULT(style);
            debug.verbosity(0) << font.style(); break;
        case QFont::UnderlineResolved:
            QFONT_DEBUG_SKIP_DEFAULT(underline);
            debug << "underline=" << font.underline(); break;
        case QFont::OverlineResolved:
            QFONT_DEBUG_SKIP_DEFAULT(overline);
            debug << "overline=" << font.overline(); break;
        case QFont::StrikeOutResolved:
            QFONT_DEBUG_SKIP_DEFAULT(strikeOut);
            debug << "strikeOut=" << font.strikeOut(); break;
        case QFont::FixedPitchResolved:
            QFONT_DEBUG_SKIP_DEFAULT(fixedPitch);
            debug << "fixedPitch=" << font.fixedPitch(); break;
        case QFont::StretchResolved:
            QFONT_DEBUG_SKIP_DEFAULT(stretch);
            debug.verbosity(0) << QFont::Stretch(font.stretch()); break;
        case QFont::KerningResolved:
            QFONT_DEBUG_SKIP_DEFAULT(kerning);
            debug << "kerning=" << font.kerning(); break;
        case QFont::CapitalizationResolved:
            QFONT_DEBUG_SKIP_DEFAULT(capitalization);
            debug.verbosity(0) << font.capitalization(); break;
        case QFont::LetterSpacingResolved:
            QFONT_DEBUG_SKIP_DEFAULT(letterSpacing);
            debug << "letterSpacing=" << font.letterSpacing();
            debug.verbosity(0) << " (" << font.letterSpacingType() << ")";
            break;
        case QFont::HintingPreferenceResolved:
            QFONT_DEBUG_SKIP_DEFAULT(hintingPreference);
            debug.verbosity(0) << font.hintingPreference(); break;
        case QFont::StyleNameResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleName);
            debug << "styleName=" << font.styleName(); break;
        default:
            continue;
        };

        #undef QFONT_DEBUG_SKIP_DEFAULT

        debug << ", ";
    }

    if (stream.verbosity() > QDebug::MinimumVerbosity)
        debug.verbosity(0) << "resolveMask=" << QFlags<QFont::ResolveProperties>(font.resolve_mask);
    else
        fontDescription.chop(2); // Last ', '

    stream << fontDescription << ')';

    return stream;
}